

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampTexParameterIErrors.cpp
# Opt level: O0

void __thiscall
glcts::TextureBorderClampTexParameterIErrorsTest::VerifyGLTexParameterIivMultipleAcceptedErrors
          (TextureBorderClampTexParameterIErrorsTest *this,GLenum target,GLenum pname,GLint params,
          GLenum expected_error1,GLenum expected_error2)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_220;
  GetNameFunc local_210;
  int local_208;
  Enum<int,_2UL> local_200;
  GetNameFunc local_1f0;
  int local_1e8;
  Enum<int,_2UL> local_1e0;
  char *local_1d0;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  long local_30;
  Functions *gl;
  GLenum error_code;
  GLenum expected_error2_local;
  GLenum expected_error1_local;
  GLint params_local;
  GLenum pname_local;
  GLenum target_local;
  TextureBorderClampTexParameterIErrorsTest *this_local;
  
  gl._0_4_ = 0;
  gl._4_4_ = expected_error2;
  error_code = expected_error1;
  expected_error2_local = params;
  expected_error1_local = pname;
  params_local = target;
  _pname_local = this;
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TextureBorderClampBase).super_TestCaseBase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_30 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_30 + 0x1340))(params_local,expected_error1_local,&expected_error2_local);
  gl._0_4_ = (**(code **)(local_30 + 0x800))();
  if ((error_code != (GLenum)gl) && (gl._4_4_ != (GLenum)gl)) {
    this->m_test_passed = '\0';
    this_00 = tcu::TestContext::getLog
                        ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [32])"glTexParameterIivEXT() failed:[");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0x2b28afd);
    local_1c8[0] = TextureBorderClampBase::getTexTargetString
                             (&this->super_TextureBorderClampBase,params_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])", pname:");
    local_1d0 = TextureBorderClampBase::getPNameString
                          (&this->super_TextureBorderClampBase,expected_error1_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1d0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [24])"] reported error code:[");
    EVar4 = glu::getErrorStr((GLenum)gl);
    local_1f0 = EVar4.m_getName;
    local_1e8 = EVar4.m_value;
    local_1e0.m_getName = local_1f0;
    local_1e0.m_value = local_1e8;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1e0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [24])"] expected error code:[");
    EVar4 = glu::getErrorStr(error_code);
    local_210 = EVar4.m_getName;
    local_208 = EVar4.m_value;
    local_200.m_getName = local_210;
    local_200.m_value = local_208;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_200);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [18])"] or error code [");
    EVar4 = glu::getErrorStr(gl._4_4_);
    local_220.m_getName = EVar4.m_getName;
    local_220.m_value = EVar4.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_220);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b3d307);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  return;
}

Assistant:

void TextureBorderClampTexParameterIErrorsTest::VerifyGLTexParameterIivMultipleAcceptedErrors(
	glw::GLenum target, glw::GLenum pname, glw::GLint params, glw::GLenum expected_error1, glw::GLenum expected_error2)
{
	glw::GLenum			  error_code = GL_NO_ERROR;
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();

	gl.texParameterIiv(target, pname, &params);

	error_code = gl.getError();
	if (expected_error1 != error_code && expected_error2 != error_code)
	{
		m_test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glTexParameterIivEXT() failed:["
						   << "target:" << getTexTargetString(target) << ", pname:" << getPNameString(pname)
						   << "] reported error code:[" << glu::getErrorStr(error_code) << "] expected error code:["
						   << glu::getErrorStr(expected_error1) << "] or error code ["
						   << glu::getErrorStr(expected_error2) << "]\n"
						   << tcu::TestLog::EndMessage;
	}
}